

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O0

void TestDoubleToFixed(void)

{
  undefined1 uVar1;
  char *pcVar2;
  StringBuilder *result_builder;
  DoubleToStringConverter dc9;
  DoubleToStringConverter dc8;
  DoubleToStringConverter dc7;
  DoubleToStringConverter dc6;
  DoubleToStringConverter dc5;
  DoubleToStringConverter dc4;
  int flags4;
  DoubleToStringConverter dc3;
  int flags3;
  DoubleToStringConverter dc2;
  int flags2;
  DoubleToStringConverter dc;
  int flags;
  StringBuilder builder;
  char buffer [128];
  int kBufferSize;
  undefined4 uVar3;
  int in_stack_fffffffffffff87c;
  undefined4 uVar4;
  int in_stack_fffffffffffff884;
  undefined4 in_stack_fffffffffffff888;
  undefined4 uVar5;
  int in_stack_fffffffffffff88c;
  undefined4 in_stack_fffffffffffff890;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffff894;
  undefined8 in_stack_fffffffffffff898;
  int line;
  undefined7 in_stack_fffffffffffff8a0;
  undefined1 in_stack_fffffffffffff8a7;
  StringBuilder *in_stack_fffffffffffff930;
  undefined8 in_stack_fffffffffffff938;
  int iVar7;
  double in_stack_fffffffffffff940;
  StringBuilder *this;
  undefined7 in_stack_fffffffffffff948;
  undefined1 in_stack_fffffffffffff94f;
  DoubleToStringConverter local_278;
  DoubleToStringConverter local_248;
  DoubleToStringConverter local_218;
  DoubleToStringConverter local_1e8;
  DoubleToStringConverter local_1b8;
  DoubleToStringConverter local_188;
  undefined4 local_154;
  DoubleToStringConverter local_150;
  undefined4 local_11c;
  DoubleToStringConverter local_118;
  undefined4 local_e8;
  DoubleToStringConverter local_d8;
  int local_a4;
  StringBuilder local_a0 [6];
  undefined4 local_4;
  
  line = (int)((ulong)in_stack_fffffffffffff898 >> 0x20);
  iVar7 = (int)((ulong)in_stack_fffffffffffff938 >> 0x20);
  local_4 = 0x80;
  double_conversion::StringBuilder::StringBuilder
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
             (char *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
             in_stack_fffffffffffff884);
  local_a4 = 9;
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_d8,9,"Infinity","NaN",'e',0,0,0,0,0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::position(local_a0);
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),in_stack_fffffffffffff87c);
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::position(local_a0);
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),in_stack_fffffffffffff87c);
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  local_e8 = 1;
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_118,1,"Infinity","NaN",'e',0,0,0,0,0);
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  local_11c = 3;
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_150,3,"Infinity","NaN",'e',0,0,0,0,0);
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  local_154 = 7;
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_188,7,"Infinity","NaN",'e',0,0,0,0,0);
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  local_a4 = 0;
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_1b8,0,(char *)0x0,(char *)0x0,'e',0,0,0,0,0);
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  local_a4 = 2;
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_1e8,2,(char *)0x0,(char *)0x0,'e',0,0,0,0,0);
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  local_a4 = 6;
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_218,6,(char *)0x0,(char *)0x0,'e',0,0,0,0,0);
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),in_stack_fffffffffffff940
             ,iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  this = local_a0;
  double_conversion::StringBuilder::Reset(this);
  uVar1 = double_conversion::DoubleToStringConverter::ToFixed
                    ((DoubleToStringConverter *)
                     CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),(double)this,
                     iVar7,in_stack_fffffffffffff930);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  pcVar2 = double_conversion::StringBuilder::Finalize
                     ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  iVar7 = (int)((ulong)pcVar2 >> 0x20);
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  uVar4 = 0;
  uVar3 = 0;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_248,local_a4,(char *)0x0,(char *)0x0,'e',0,0,0,0,0);
  double_conversion::StringBuilder::Reset(local_a0);
  result_builder = (StringBuilder *)double_conversion::Double::Infinity();
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)CONCAT17(uVar1,in_stack_fffffffffffff948),(double)this,iVar7
             ,result_builder);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar4),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar3),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::Double::Infinity();
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)CONCAT17(uVar1,in_stack_fffffffffffff948),(double)this,iVar7
             ,result_builder);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar4),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar3),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::Double::NaN();
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)CONCAT17(uVar1,in_stack_fffffffffffff948),(double)this,iVar7
             ,result_builder);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar4),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar3),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::Double::NaN();
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)CONCAT17(uVar1,in_stack_fffffffffffff948),(double)this,iVar7
             ,result_builder);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar4),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar3),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_278,local_a4,"Infinity","NaN",'e',0,0,0,0,0);
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::Double::Infinity();
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)CONCAT17(uVar1,in_stack_fffffffffffff948),(double)this,iVar7
             ,result_builder);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::Double::Infinity();
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)CONCAT17(uVar1,in_stack_fffffffffffff948),(double)this,iVar7
             ,result_builder);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::Double::NaN();
  double_conversion::DoubleToStringConverter::ToFixed
            ((DoubleToStringConverter *)CONCAT17(uVar1,in_stack_fffffffffffff948),(double)this,iVar7
             ,result_builder);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),line,
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::Double::NaN();
  uVar1 = double_conversion::DoubleToStringConverter::ToFixed
                    ((DoubleToStringConverter *)CONCAT17(uVar1,in_stack_fffffffffffff948),
                     (double)this,iVar7,result_builder);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffff894,uVar6),in_stack_fffffffffffff88c,
              (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
              SUB41((uint)in_stack_fffffffffffff87c >> 0x18,0));
  pcVar2 = double_conversion::StringBuilder::Finalize
                     ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  CheckEqualsHelper((char *)CONCAT17(uVar1,in_stack_fffffffffffff8a0),(int)((ulong)pcVar2 >> 0x20),
                    (char *)CONCAT44(in_stack_fffffffffffff894,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffff88c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffff884,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffff87c,uVar3));
  double_conversion::StringBuilder::~StringBuilder
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffff884,uVar4));
  return;
}

Assistant:

TEST(DoubleToFixed) {
  const int kBufferSize = 128;
  char buffer[kBufferSize];
  StringBuilder builder(buffer, kBufferSize);
  int flags = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN |
      DoubleToStringConverter::UNIQUE_ZERO;
  DoubleToStringConverter dc(flags, "Infinity", "NaN", 'e',
                             0, 0, 0, 0);  // Padding zeroes.

  CHECK(dc.ToFixed(0.0, 0, &builder));
  CHECK_EQ("0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(-0.0, 0, &builder));
  CHECK_EQ("0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(-0.0, 1, &builder));
  CHECK_EQ("0.0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(-0.0, 1, &builder));
  CHECK_EQ("0.0", builder.Finalize());

  DOUBLE_CONVERSION_ASSERT(DoubleToStringConverter::kMaxFixedDigitsBeforePoint == 60);
  DOUBLE_CONVERSION_ASSERT(DoubleToStringConverter::kMaxFixedDigitsAfterPoint == 60);
  builder.Reset();
  CHECK(dc.ToFixed(
      0.0, DoubleToStringConverter::kMaxFixedDigitsAfterPoint, &builder));
  CHECK_EQ("0.000000000000000000000000000000000000000000000000000000000000",
           builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(
      9e59, DoubleToStringConverter::kMaxFixedDigitsAfterPoint, &builder));
  CHECK_EQ("899999999999999918767229449717619953810131273674690656206848."
           "000000000000000000000000000000000000000000000000000000000000",
           builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(
      -9e59, DoubleToStringConverter::kMaxFixedDigitsAfterPoint, &builder));
  CHECK_EQ("-899999999999999918767229449717619953810131273674690656206848."
           "000000000000000000000000000000000000000000000000000000000000",
           builder.Finalize());

  builder.Reset();
  CHECK(!dc.ToFixed(
      1e60, DoubleToStringConverter::kMaxFixedDigitsAfterPoint, &builder));
  CHECK_EQ(0, builder.position());

  builder.Reset();
  CHECK(!dc.ToFixed(
      9e59, DoubleToStringConverter::kMaxFixedDigitsAfterPoint + 1, &builder));
  CHECK_EQ(0, builder.position());

  builder.Reset();
  CHECK(dc.ToFixed(3.0, 0, &builder));
  CHECK_EQ("3", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(3.23, 1, &builder));
  CHECK_EQ("3.2", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(3.23, 3, &builder));
  CHECK_EQ("3.230", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.0323, 2, &builder));
  CHECK_EQ("0.03", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.0373, 2, &builder));
  CHECK_EQ("0.04", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.0000373, 2, &builder));
  CHECK_EQ("0.00", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(1.5, 0, &builder));
  CHECK_EQ("2", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(2.5, 0, &builder));
  CHECK_EQ("3", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(3.5, 0, &builder));
  CHECK_EQ("4", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.15, 1, &builder));
  CHECK_EQ("0.1", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.25, 1, &builder));
  CHECK_EQ("0.3", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.35, 1, &builder));
  CHECK_EQ("0.3", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.45, 1, &builder));
  CHECK_EQ("0.5", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToFixed(0.55, 1, &builder));
  CHECK_EQ("0.6", builder.Finalize());

  // Test positive/negative zeroes.
  int flags2 = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN;
  DoubleToStringConverter dc2(flags2, "Infinity", "NaN", 'e',
                              0, 0, 0, 0);  // Padding zeroes.
  builder.Reset();
  CHECK(dc2.ToFixed(0.0, 1, &builder));
  CHECK_EQ("0.0", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToFixed(-0.0, 1, &builder));
  CHECK_EQ("-0.0", builder.Finalize());

  // Verify the trailing dot is emitted.
  int flags3 = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN |
      DoubleToStringConverter::EMIT_TRAILING_DECIMAL_POINT;
  DoubleToStringConverter dc3(flags3, "Infinity", "NaN", 'e',
                              0, 0, 0, 0);  // Padding zeroes.
  builder.Reset();
  CHECK(dc3.ToFixed(0.0, 0, &builder));
  CHECK_EQ("0.", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToFixed(-0.0, 0, &builder));
  CHECK_EQ("-0.", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToFixed(1.0, 0, &builder));
  CHECK_EQ("1.", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToFixed(-1.0, 0, &builder));
  CHECK_EQ("-1.", builder.Finalize());

  // Verify no trailing zero is emitted, even if the configuration is set.
  // The given parameter takes precedence.
  int flags4 = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN |
      DoubleToStringConverter::EMIT_TRAILING_DECIMAL_POINT |
      DoubleToStringConverter::EMIT_TRAILING_ZERO_AFTER_POINT;
  DoubleToStringConverter dc4(flags4, "Infinity", "NaN", 'e',
                              0, 0, 0, 0);  // Padding zeroes.
  builder.Reset();
  CHECK(dc4.ToFixed(0.0, 0, &builder));
  CHECK_EQ("0.0", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToFixed(-0.0, 0, &builder));
  CHECK_EQ("-0.0", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToFixed(1.0, 0, &builder));
  CHECK_EQ("1.0", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToFixed(-1.0, 0, &builder));
  CHECK_EQ("-1.0", builder.Finalize());

  // Test the examples in the comments of ToFixed.
  flags = DoubleToStringConverter::NO_FLAGS;
  DoubleToStringConverter dc5(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc5.ToFixed(3.12, 1, &builder));
  CHECK_EQ("3.1", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(3.1415, 3, &builder));
  CHECK_EQ("3.142", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(1234.56789, 4, &builder));
  CHECK_EQ("1234.5679", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(1.23, 5, &builder));
  CHECK_EQ("1.23000", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(0.1, 4, &builder));
  CHECK_EQ("0.1000", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(1e30, 2, &builder));
  CHECK_EQ("1000000000000000019884624838656.00", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(0.1, 30, &builder));
  CHECK_EQ("0.100000000000000005551115123126", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(0.1, 17, &builder));
  CHECK_EQ("0.10000000000000001", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(123.45, 0, &builder));
  CHECK_EQ("123", builder.Finalize());

  builder.Reset();
  CHECK(dc5.ToFixed(0.678, 0, &builder));
  CHECK_EQ("1", builder.Finalize());

  flags = DoubleToStringConverter::EMIT_TRAILING_DECIMAL_POINT;
  DoubleToStringConverter dc6(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc6.ToFixed(123.45, 0, &builder));
  CHECK_EQ("123.", builder.Finalize());

  builder.Reset();
  CHECK(dc6.ToFixed(0.678, 0, &builder));
  CHECK_EQ("1.", builder.Finalize());

  flags = DoubleToStringConverter::EMIT_TRAILING_DECIMAL_POINT |
      DoubleToStringConverter::EMIT_TRAILING_ZERO_AFTER_POINT;
  DoubleToStringConverter dc7(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc7.ToFixed(123.45, 0, &builder));
  CHECK_EQ("123.0", builder.Finalize());

  builder.Reset();
  CHECK(dc7.ToFixed(0.678, 0, &builder));
  CHECK_EQ("1.0", builder.Finalize());

  // Test special value handling.
  DoubleToStringConverter dc8(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(!dc8.ToFixed(Double::Infinity(), 1, &builder));

  builder.Reset();
  CHECK(!dc8.ToFixed(-Double::Infinity(), 1, &builder));

  builder.Reset();
  CHECK(!dc8.ToFixed(Double::NaN(), 1, &builder));

  builder.Reset();
  CHECK(!dc8.ToFixed(-Double::NaN(), 1, &builder));

  DoubleToStringConverter dc9(flags, "Infinity", "NaN", 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc9.ToFixed(Double::Infinity(), 1, &builder));
  CHECK_EQ("Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc9.ToFixed(-Double::Infinity(), 1, &builder));
  CHECK_EQ("-Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc9.ToFixed(Double::NaN(), 1, &builder));
  CHECK_EQ("NaN", builder.Finalize());

  builder.Reset();
  CHECK(dc9.ToFixed(-Double::NaN(), 1, &builder));
  CHECK_EQ("NaN", builder.Finalize());
}